

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O0

bool __thiscall ON_CompressedBuffer::WriteChar(ON_CompressedBuffer *this,size_t count,void *buffer)

{
  void *pvVar1;
  ulong local_38;
  size_t delta;
  bool rc;
  void *buffer_local;
  size_t count_local;
  ON_CompressedBuffer *this_local;
  
  this_local._7_1_ = true;
  if ((count == 0) || (buffer == (void *)0x0)) {
    this_local._7_1_ = count == 0;
  }
  else {
    if (this->m_buffer_compressed_capacity < count + this->m_sizeof_compressed) {
      local_38 = (count + this->m_sizeof_compressed) - this->m_buffer_compressed_capacity;
      if (local_38 < 0x800) {
        local_38 = 0x800;
      }
      if (local_38 < this->m_buffer_compressed_capacity >> 2) {
        local_38 = this->m_buffer_compressed_capacity >> 2;
      }
      this->m_buffer_compressed_capacity = local_38 + this->m_buffer_compressed_capacity;
      pvVar1 = onrealloc(this->m_buffer_compressed,this->m_buffer_compressed_capacity);
      this->m_buffer_compressed = pvVar1;
      if (this->m_buffer_compressed == (void *)0x0) {
        this->m_buffer_compressed_capacity = 0;
        this->m_sizeof_compressed = 0;
        return false;
      }
    }
    memcpy((void *)((long)this->m_buffer_compressed + this->m_sizeof_compressed),buffer,count);
    this->m_sizeof_compressed = count + this->m_sizeof_compressed;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_CompressedBuffer::WriteChar( 
        size_t count, const void* buffer         
        )
{
  bool rc = true;
  if ( count > 0 && buffer )
  {
    if ( count + m_sizeof_compressed > m_buffer_compressed_capacity )
    {
      size_t delta = count + m_sizeof_compressed - m_buffer_compressed_capacity;
      if ( delta < 2048 )
        delta = 2048;
      if ( delta < m_buffer_compressed_capacity/4 )
        delta = m_buffer_compressed_capacity/4;
      m_buffer_compressed_capacity += delta;
      m_buffer_compressed = onrealloc(m_buffer_compressed,m_buffer_compressed_capacity);
      if ( !m_buffer_compressed )
      {
        m_buffer_compressed_capacity = 0;
        m_sizeof_compressed = 0;
        return false;
      }
    }
    memcpy(((char*)m_buffer_compressed)+m_sizeof_compressed,buffer,count);
    m_sizeof_compressed += count;
  }
  else
  {
    rc = (0 == count);
  }
  return rc;
}